

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ulong *puVar10;
  ulong *puVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  int *piVar16;
  U32 *hashTable;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  ulong *puVar20;
  char cVar21;
  char *__s;
  ulong *puVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  BYTE *e;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int *piVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong *puVar33;
  ulong *puVar34;
  BYTE *s;
  ulong *puVar35;
  ulong *puVar36;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar30 = (LZ4_dict->internal_donotuse).dictSize;
  uVar28 = (ulong)uVar30;
  pcVar23 = dest;
  puVar35 = (ulong *)source;
  if (uVar28 < 0x10000) {
    uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
    if (uVar2 <= uVar30) goto LAB_00111d6e;
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize != 0) {
        piVar4 = (int *)(LZ4_dict->internal_donotuse).dictionary;
        lVar13 = uVar28 + (long)piVar4;
        lVar27 = lVar13 - (ulong)uVar2;
        if (piVar4 == (int *)0x0) {
          lVar27 = 0;
        }
        (LZ4_dict->internal_donotuse).dictSize = uVar30 + srcSize;
        (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
        (LZ4_dict->internal_donotuse).tableType = 2;
        if (0xc < (uint)srcSize) {
          lVar26 = (long)source - (ulong)uVar2;
          puVar11 = (ulong *)(source + ((ulong)(uint)srcSize - 0xb));
          puVar10 = (ulong *)(source + ((ulong)(uint)srcSize - 5));
          if (piVar4 == (int *)0x0) {
            lVar13 = 0;
          }
          *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
               uVar2;
          puVar36 = (ulong *)(source + 2);
          puVar22 = (ulong *)(source + 1);
          uVar31 = uVar2 + 1;
          puVar1 = (ulong *)(source + ((ulong)(uint)srcSize - 0xc));
LAB_001126ad:
          uVar28 = *(ulong *)((long)puVar35 + 1);
          uVar24 = 1;
          uVar8 = 0x41;
          do {
            uVar17 = uVar28 * -0x30e4432345000000 >> 0x34;
            uVar3 = *(uint *)((long)LZ4_dict + uVar17 * 4);
            uVar28 = *puVar36;
            *(uint *)((long)LZ4_dict + uVar17 * 4) = uVar31;
            iVar7 = (int)lVar26;
            if ((uVar2 - uVar30 <= uVar3) && (uVar31 <= uVar3 + 0xffff)) {
              lVar19 = lVar27;
              if (uVar2 <= uVar3) {
                lVar19 = lVar26;
              }
              if (*(int *)(lVar19 + (ulong)uVar3) == (int)*puVar22) goto LAB_0011273c;
            }
            uVar31 = (int)puVar36 - iVar7;
            puVar18 = (ulong *)(uVar24 + (long)puVar36);
            uVar24 = (ulong)(uVar8 >> 6);
            puVar22 = puVar36;
            puVar36 = puVar18;
            uVar8 = uVar8 + 1;
            if (puVar11 < puVar18) break;
          } while( true );
        }
        goto LAB_00111dfc;
      }
      goto LAB_00111e7f;
    }
  }
  else {
LAB_00111d6e:
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize != 0) {
        uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
        piVar4 = (int *)(LZ4_dict->internal_donotuse).dictionary;
        lVar13 = uVar28 + (long)piVar4;
        lVar27 = lVar13 - (ulong)uVar2;
        if (piVar4 == (int *)0x0) {
          lVar27 = 0;
        }
        (LZ4_dict->internal_donotuse).dictSize = uVar30 + srcSize;
        (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
        (LZ4_dict->internal_donotuse).tableType = 2;
        if (0xc < (uint)srcSize) {
          lVar26 = (long)source - (ulong)uVar2;
          puVar11 = (ulong *)(source + ((ulong)(uint)srcSize - 0xb));
          puVar10 = (ulong *)(source + ((ulong)(uint)srcSize - 5));
          if (piVar4 == (int *)0x0) {
            lVar13 = 0;
          }
          *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
               uVar2;
          puVar36 = (ulong *)(source + 2);
          puVar22 = (ulong *)(source + 1);
          uVar30 = uVar2 + 1;
          puVar1 = (ulong *)(source + ((ulong)(uint)srcSize - 0xc));
LAB_00111f83:
          uVar28 = *(ulong *)((long)puVar35 + 1);
          uVar24 = 1;
          uVar31 = 0x41;
          do {
            uVar17 = uVar28 * -0x30e4432345000000 >> 0x34;
            uVar8 = *(uint *)((long)LZ4_dict + uVar17 * 4);
            uVar28 = *puVar36;
            *(uint *)((long)LZ4_dict + uVar17 * 4) = uVar30;
            iVar7 = (int)lVar26;
            if (uVar30 <= uVar8 + 0xffff) {
              lVar19 = lVar27;
              if (uVar2 <= uVar8) {
                lVar19 = lVar26;
              }
              if (*(int *)(lVar19 + (ulong)uVar8) == (int)*puVar22) goto LAB_00112009;
            }
            uVar30 = (int)puVar36 - iVar7;
            puVar18 = (ulong *)(uVar24 + (long)puVar36);
            uVar24 = (ulong)(uVar31 >> 6);
            puVar22 = puVar36;
            puVar36 = puVar18;
            uVar31 = uVar31 + 1;
            if (puVar11 < puVar18) break;
          } while( true );
        }
LAB_00111dfc:
        pcVar14 = source + ((ulong)(uint)srcSize - (long)puVar35);
        if (pcVar14 < (char *)0xf) {
          *pcVar23 = (char)pcVar14 << 4;
        }
        else {
          pcVar9 = pcVar14 + -0xf;
          *pcVar23 = -0x10;
          __s = pcVar23 + 1;
          if ((char *)0xfe < pcVar9) {
            uVar28 = (ulong)(pcVar14 + -0x10e) / 0xff;
            memset(__s,0xff,uVar28 + 1);
            __s = pcVar23 + uVar28 + 2;
            pcVar9 = pcVar14 + uVar28 * -0xff + -0x10e;
          }
          *__s = (char)pcVar9;
          pcVar23 = __s;
        }
        memcpy(pcVar23 + 1,puVar35,(size_t)pcVar14);
        iVar7 = ((int)(pcVar23 + 1) + (int)pcVar14) - (int)dest;
        goto LAB_00111ebc;
      }
LAB_00111e7f:
      *dest = '\0';
      iVar7 = 1;
      goto LAB_00111ebc;
    }
  }
  iVar7 = 0;
LAB_00111ebc:
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar7;
LAB_00112009:
  lVar19 = lVar19 + (ulong)uVar8;
  piVar16 = (int *)source;
  if (uVar8 < uVar2) {
    piVar16 = piVar4;
  }
  iVar32 = uVar30 - uVar8;
  iVar12 = (int)puVar22 - (int)puVar35;
  lVar5 = 0;
  uVar30 = iVar12 - 0xfU;
  cVar6 = (char)puVar22 * '\x10' + (char)puVar35 * -0x10;
  do {
    cVar21 = cVar6;
    uVar31 = uVar30;
    lVar25 = lVar5;
    piVar29 = (int *)(lVar19 + lVar25);
    puVar36 = (ulong *)((long)puVar22 + lVar25);
    if ((piVar29 <= piVar16) || (puVar36 <= puVar35)) break;
    lVar5 = lVar25 + -1;
    uVar30 = uVar31 - 1;
    cVar6 = cVar21 + -0x10;
  } while (*(char *)((long)puVar22 + lVar25 + -1) == *(char *)(lVar19 + -1 + lVar25));
  iVar15 = (int)lVar25;
  puVar22 = (ulong *)(pcVar23 + 1);
  if ((uint)(iVar12 + iVar15) < 0xf) {
    *pcVar23 = cVar21;
  }
  else {
    uVar28 = (ulong)(iVar12 - 0xfU) + lVar25;
    *pcVar23 = -0x10;
    if (0xfe < (int)uVar28) {
      uVar30 = 0x1fd;
      if (uVar31 < 0x1fd) {
        uVar30 = uVar31;
      }
      if (0x1fc < (int)uVar31) {
        uVar31 = 0x1fd;
      }
      memset(puVar22,0xff,(ulong)((((iVar12 + 0xef) - uVar30) + iVar15) / 0xff + 1));
      uVar30 = ((iVar12 + 0xef) - uVar31) + iVar15;
      puVar22 = (ulong *)(pcVar23 + (ulong)uVar30 / 0xff + 2);
      uVar28 = (ulong)(iVar12 + -0x10e + iVar15 + uVar30 / 0xff);
    }
    *(char *)puVar22 = (char)uVar28;
    puVar22 = (ulong *)((long)puVar22 + 1);
  }
  puVar18 = (ulong *)((ulong)(uint)((int)puVar36 - (int)puVar35) + (long)puVar22);
  do {
    *puVar22 = *puVar35;
    puVar22 = puVar22 + 1;
    puVar35 = puVar35 + 1;
    pcVar14 = pcVar23;
  } while (puVar22 < puVar18);
  do {
    *(short *)puVar18 = (short)iVar32;
    if (piVar16 == piVar4) {
      puVar22 = (ulong *)((lVar13 - (long)piVar29) + (long)puVar36);
      if (puVar10 < puVar22) {
        puVar22 = puVar10;
      }
      puVar35 = (ulong *)((long)puVar36 + 4);
      puVar20 = (ulong *)(piVar29 + 1);
      puVar33 = (ulong *)((long)puVar22 - 7);
      puVar34 = puVar35;
      if (puVar35 < puVar33) {
        if (*puVar20 == *puVar35) {
          puVar20 = (ulong *)(piVar29 + 3);
          puVar34 = (ulong *)((long)puVar36 + 0xc);
          goto LAB_00112234;
        }
        uVar24 = *puVar35 ^ *puVar20;
        uVar28 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
      }
      else {
LAB_00112234:
        if (puVar34 < puVar33) {
          iVar12 = ((int)puVar34 - (int)puVar36) + -4;
LAB_00112243:
          if (*puVar20 == *puVar34) goto code_r0x00112252;
          uVar24 = *puVar34 ^ *puVar20;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
          goto LAB_001122ff;
        }
LAB_00112263:
        if ((puVar34 < (ulong *)((long)puVar22 - 3U)) && ((int)*puVar20 == (int)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar34 < (ulong *)((long)puVar22 - 1U)) && ((short)*puVar20 == (short)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar34 < puVar22) {
          puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar20 == (char)*puVar34));
        }
        uVar28 = (ulong)(uint)((int)puVar34 - (int)puVar35);
      }
LAB_001122ff:
      uVar30 = (uint)uVar28;
      puVar35 = (ulong *)((long)puVar36 + uVar28 + 4);
      if (puVar35 == puVar22) {
        puVar33 = puVar22;
        puVar20 = (ulong *)source;
        if (puVar22 < puVar1) {
          if (*(ulong *)source == *puVar22) {
            puVar33 = puVar22 + 1;
            puVar20 = (ulong *)(source + 8);
            goto LAB_00112345;
          }
          uVar24 = *puVar22 ^ *(ulong *)source;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
        }
        else {
LAB_00112345:
          if (puVar33 < puVar1) {
            puVar36 = (ulong *)((long)puVar36 + (lVar13 - (long)piVar29));
            if (puVar10 <= puVar36) {
              puVar36 = puVar10;
            }
            iVar12 = (int)puVar33 - (int)puVar36;
LAB_00112373:
            if (*puVar20 == *puVar33) goto code_r0x0011237e;
            uVar24 = *puVar33 ^ *puVar20;
            uVar28 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
            goto LAB_001123bb;
          }
LAB_00112570:
          if ((puVar33 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar20 == (int)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar33 < source + ((ulong)(uint)srcSize - 6)) &&
             ((short)*puVar20 == (short)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar33 < puVar10) {
            puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar20 == (char)*puVar33));
          }
          uVar28 = (ulong)(uint)((int)puVar33 - (int)puVar22);
        }
LAB_001123bb:
        uVar30 = uVar30 + (int)uVar28;
        puVar35 = (ulong *)((long)puVar35 + uVar28);
      }
    }
    else {
      puVar35 = (ulong *)((long)puVar36 + 4);
      puVar22 = (ulong *)(piVar29 + 1);
      puVar33 = puVar35;
      if (puVar35 < puVar1) {
        if (*puVar22 == *puVar35) {
          puVar22 = (ulong *)(piVar29 + 3);
          puVar33 = (ulong *)((long)puVar36 + 0xc);
          goto LAB_001121b0;
        }
        uVar24 = *puVar35 ^ *puVar22;
        uVar28 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
      }
      else {
LAB_001121b0:
        if (puVar33 < puVar1) {
          iVar12 = ((int)puVar33 - (int)puVar36) + -4;
LAB_001121cb:
          if (*puVar22 == *puVar33) break;
          uVar24 = *puVar33 ^ *puVar22;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
          goto LAB_001122cb;
        }
LAB_001124f8:
        if ((puVar33 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar22 == (int)*puVar33)) {
          puVar33 = (ulong *)((long)puVar33 + 4);
          puVar22 = (ulong *)((long)puVar22 + 4);
        }
        if ((puVar33 < source + ((ulong)(uint)srcSize - 6)) && ((short)*puVar22 == (short)*puVar33))
        {
          puVar33 = (ulong *)((long)puVar33 + 2);
          puVar22 = (ulong *)((long)puVar22 + 2);
        }
        if (puVar33 < puVar10) {
          puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar22 == (char)*puVar33));
        }
        uVar28 = (ulong)(uint)((int)puVar33 - (int)puVar35);
      }
LAB_001122cb:
      uVar30 = (uint)uVar28;
      puVar35 = (ulong *)((long)puVar36 + uVar28 + 4);
    }
    pcVar23 = (char *)((long)puVar18 + 2);
    if (uVar30 < 0xf) {
      *pcVar14 = *pcVar14 + (char)uVar30;
    }
    else {
      *pcVar14 = *pcVar14 + '\x0f';
      uVar31 = uVar30 - 0xf;
      pcVar23[0] = -1;
      pcVar23[1] = -1;
      pcVar23[2] = -1;
      pcVar23[3] = -1;
      if (0x3fb < uVar31) {
        uVar28 = (ulong)(((uVar30 - 0x40b) / 0x3fc) * 4);
        memset((char *)((long)puVar18 + 6),0xff,uVar28 + 4);
        uVar31 = (uVar30 - 0x40b) % 0x3fc;
        pcVar23 = (char *)((long)puVar18 + uVar28 + 6);
      }
      uVar30 = (uVar31 & 0xffff) / 0xff;
      pcVar14 = pcVar23 + uVar30;
      pcVar23 = pcVar14 + 1;
      *pcVar14 = (char)uVar30 + (char)uVar31;
    }
    if (puVar11 <= puVar35) goto LAB_00111dfc;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar35 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar35 + -2) - iVar7;
    uVar28 = *puVar35 * -0x30e4432345000000 >> 0x34;
    uVar31 = (int)puVar35 - iVar7;
    uVar30 = *(uint *)((long)LZ4_dict + uVar28 * 4);
    piVar16 = (int *)source;
    lVar19 = lVar26;
    if (uVar30 < uVar2) {
      piVar16 = piVar4;
      lVar19 = lVar27;
    }
    *(uint *)((long)LZ4_dict + uVar28 * 4) = uVar31;
    if ((uVar30 + 0xffff < uVar31) ||
       (piVar29 = (int *)(lVar19 + (ulong)uVar30), *piVar29 != (int)*puVar35)) goto LAB_001125db;
    puVar18 = (ulong *)(pcVar23 + 1);
    *pcVar23 = '\0';
    iVar32 = uVar31 - uVar30;
    pcVar14 = pcVar23;
    puVar36 = puVar35;
  } while( true );
  puVar33 = puVar33 + 1;
  puVar22 = puVar22 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar33) goto LAB_001124f8;
  goto LAB_001121cb;
code_r0x00112252:
  puVar34 = puVar34 + 1;
  puVar20 = puVar20 + 1;
  iVar12 = iVar12 + 8;
  if (puVar33 <= puVar34) goto LAB_00112263;
  goto LAB_00112243;
code_r0x0011237e:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar33) goto LAB_00112570;
  goto LAB_00112373;
LAB_001125db:
  puVar22 = (ulong *)((long)puVar35 + 1);
  uVar30 = (int)puVar22 - iVar7;
  puVar36 = (ulong *)((long)puVar35 + 2);
  if (puVar11 < puVar36) goto LAB_00111dfc;
  goto LAB_00111f83;
LAB_0011273c:
  lVar19 = lVar19 + (ulong)uVar3;
  piVar16 = (int *)source;
  if (uVar3 < uVar2) {
    piVar16 = piVar4;
  }
  iVar32 = uVar31 - uVar3;
  iVar12 = (int)puVar22 - (int)puVar35;
  lVar5 = 0;
  cVar6 = (char)puVar22 * '\x10' + (char)puVar35 * -0x10;
  uVar31 = iVar12 - 0xfU;
  do {
    uVar8 = uVar31;
    cVar21 = cVar6;
    lVar25 = lVar5;
    piVar29 = (int *)(lVar19 + lVar25);
    puVar36 = (ulong *)((long)puVar22 + lVar25);
    if ((piVar29 <= piVar16) || (puVar36 <= puVar35)) break;
    lVar5 = lVar25 + -1;
    cVar6 = cVar21 + -0x10;
    uVar31 = uVar8 - 1;
  } while (*(char *)((long)puVar22 + lVar25 + -1) == *(char *)(lVar19 + -1 + lVar25));
  iVar15 = (int)lVar25;
  puVar22 = (ulong *)(pcVar23 + 1);
  if ((uint)(iVar12 + iVar15) < 0xf) {
    *pcVar23 = cVar21;
  }
  else {
    uVar28 = (ulong)(iVar12 - 0xfU) + lVar25;
    *pcVar23 = -0x10;
    if (0xfe < (int)uVar28) {
      uVar31 = 0x1fd;
      if (uVar8 < 0x1fd) {
        uVar31 = uVar8;
      }
      if (0x1fc < (int)uVar8) {
        uVar8 = 0x1fd;
      }
      memset(puVar22,0xff,(ulong)((((iVar12 + 0xef) - uVar31) + iVar15) / 0xff + 1));
      uVar31 = ((iVar12 + 0xef) - uVar8) + iVar15;
      puVar22 = (ulong *)(pcVar23 + (ulong)uVar31 / 0xff + 2);
      uVar28 = (ulong)(iVar12 + -0x10e + iVar15 + uVar31 / 0xff);
    }
    *(char *)puVar22 = (char)uVar28;
    puVar22 = (ulong *)((long)puVar22 + 1);
  }
  puVar18 = (ulong *)((ulong)(uint)((int)puVar36 - (int)puVar35) + (long)puVar22);
  do {
    *puVar22 = *puVar35;
    puVar22 = puVar22 + 1;
    puVar35 = puVar35 + 1;
  } while (puVar22 < puVar18);
  do {
    *(short *)puVar18 = (short)iVar32;
    if (piVar16 == piVar4) {
      puVar22 = (ulong *)((lVar13 - (long)piVar29) + (long)puVar36);
      if (puVar10 < puVar22) {
        puVar22 = puVar10;
      }
      puVar35 = (ulong *)((long)puVar36 + 4);
      puVar20 = (ulong *)(piVar29 + 1);
      puVar33 = (ulong *)((long)puVar22 - 7);
      puVar34 = puVar35;
      if (puVar35 < puVar33) {
        if (*puVar20 == *puVar35) {
          puVar20 = (ulong *)(piVar29 + 3);
          puVar34 = (ulong *)((long)puVar36 + 0xc);
          goto LAB_0011298f;
        }
        uVar24 = *puVar35 ^ *puVar20;
        uVar28 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
      }
      else {
LAB_0011298f:
        if (puVar34 < puVar33) {
          iVar12 = ((int)puVar34 - (int)puVar36) + -4;
LAB_001129a1:
          if (*puVar20 == *puVar34) break;
          uVar24 = *puVar34 ^ *puVar20;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
          goto LAB_00112a66;
        }
LAB_001129c1:
        if ((puVar34 < (ulong *)((long)puVar22 - 3U)) && ((int)*puVar20 == (int)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar34 < (ulong *)((long)puVar22 - 1U)) && ((short)*puVar20 == (short)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar34 < puVar22) {
          puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar20 == (char)*puVar34));
        }
        uVar28 = (ulong)(uint)((int)puVar34 - (int)puVar35);
      }
LAB_00112a66:
      uVar31 = (uint)uVar28;
      puVar35 = (ulong *)((long)puVar36 + uVar28 + 4);
      if (puVar35 == puVar22) {
        puVar33 = puVar22;
        puVar20 = (ulong *)source;
        if (puVar22 < puVar1) {
          if (*(ulong *)source == *puVar22) {
            puVar33 = puVar22 + 1;
            puVar20 = (ulong *)(source + 8);
            goto LAB_00112aa8;
          }
          uVar24 = *puVar22 ^ *(ulong *)source;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
        }
        else {
LAB_00112aa8:
          if (puVar33 < puVar1) {
            puVar36 = (ulong *)((long)puVar36 + (lVar13 - (long)piVar29));
            if (puVar10 <= puVar36) {
              puVar36 = puVar10;
            }
            iVar12 = (int)puVar33 - (int)puVar36;
LAB_00112ad1:
            if (*puVar20 == *puVar33) goto code_r0x00112adc;
            uVar24 = *puVar33 ^ *puVar20;
            uVar28 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
            goto LAB_00112b5e;
          }
LAB_00112aed:
          if ((puVar33 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar20 == (int)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar33 < source + ((ulong)(uint)srcSize - 6)) &&
             ((short)*puVar20 == (short)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar33 < puVar10) {
            puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar20 == (char)*puVar33));
          }
          uVar28 = (ulong)(uint)((int)puVar33 - (int)puVar22);
        }
LAB_00112b5e:
        uVar31 = uVar31 + (int)uVar28;
        puVar35 = (ulong *)((long)puVar35 + uVar28);
      }
    }
    else {
      puVar35 = (ulong *)((long)puVar36 + 4);
      puVar22 = (ulong *)(piVar29 + 1);
      puVar33 = puVar35;
      if (puVar35 < puVar1) {
        if (*puVar22 == *puVar35) {
          puVar22 = (ulong *)(piVar29 + 3);
          puVar33 = (ulong *)((long)puVar36 + 0xc);
          goto LAB_001128ef;
        }
        uVar24 = *puVar35 ^ *puVar22;
        uVar28 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
      }
      else {
LAB_001128ef:
        if (puVar33 < puVar1) {
          iVar12 = ((int)puVar33 - (int)puVar36) + -4;
LAB_00112902:
          if (*puVar22 == *puVar33) goto code_r0x00112911;
          uVar24 = *puVar33 ^ *puVar22;
          uVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = (ulong)(((uint)(uVar28 >> 3) & 0x1fffffff) + iVar12);
          goto LAB_00112a30;
        }
LAB_00112921:
        if ((puVar33 < source + ((ulong)(uint)srcSize - 8)) && ((int)*puVar22 == (int)*puVar33)) {
          puVar33 = (ulong *)((long)puVar33 + 4);
          puVar22 = (ulong *)((long)puVar22 + 4);
        }
        if ((puVar33 < source + ((ulong)(uint)srcSize - 6)) && ((short)*puVar22 == (short)*puVar33))
        {
          puVar33 = (ulong *)((long)puVar33 + 2);
          puVar22 = (ulong *)((long)puVar22 + 2);
        }
        if (puVar33 < puVar10) {
          puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar22 == (char)*puVar33));
        }
        uVar28 = (ulong)(uint)((int)puVar33 - (int)puVar35);
      }
LAB_00112a30:
      uVar31 = (uint)uVar28;
      puVar35 = (ulong *)((long)puVar36 + uVar28 + 4);
    }
    pcVar14 = (char *)((long)puVar18 + 2);
    if (uVar31 < 0xf) {
      *pcVar23 = *pcVar23 + (char)uVar31;
      pcVar23 = pcVar14;
    }
    else {
      *pcVar23 = *pcVar23 + '\x0f';
      uVar8 = uVar31 - 0xf;
      pcVar14[0] = -1;
      pcVar14[1] = -1;
      pcVar14[2] = -1;
      pcVar14[3] = -1;
      if (0x3fb < uVar8) {
        uVar28 = (ulong)(((uVar31 - 0x40b) / 0x3fc) * 4);
        memset((char *)((long)puVar18 + 6),0xff,uVar28 + 4);
        uVar8 = (uVar31 - 0x40b) % 0x3fc;
        pcVar14 = (char *)((long)puVar18 + uVar28 + 6);
      }
      uVar31 = (uVar8 & 0xffff) / 0xff;
      pcVar14[uVar31] = (char)uVar31 + (char)uVar8;
      pcVar23 = pcVar14 + uVar31 + 1;
    }
    if (puVar11 <= puVar35) goto LAB_00111dfc;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar35 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar35 + -2) - iVar7;
    uVar28 = *puVar35 * -0x30e4432345000000 >> 0x34;
    uVar8 = (int)puVar35 - iVar7;
    uVar31 = *(uint *)((long)LZ4_dict + uVar28 * 4);
    piVar16 = (int *)source;
    lVar19 = lVar26;
    if (uVar31 < uVar2) {
      piVar16 = piVar4;
      lVar19 = lVar27;
    }
    *(uint *)((long)LZ4_dict + uVar28 * 4) = uVar8;
    if (((uVar31 < uVar2 - uVar30) || (uVar31 + 0xffff < uVar8)) ||
       (piVar29 = (int *)(lVar19 + (ulong)uVar31), *piVar29 != (int)*puVar35)) goto LAB_00112d55;
    puVar18 = (ulong *)(pcVar23 + 1);
    *pcVar23 = '\0';
    iVar32 = uVar8 - uVar31;
    puVar36 = puVar35;
  } while( true );
  puVar34 = puVar34 + 1;
  puVar20 = puVar20 + 1;
  iVar12 = iVar12 + 8;
  if (puVar33 <= puVar34) goto LAB_001129c1;
  goto LAB_001129a1;
code_r0x00112adc:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar33) goto LAB_00112aed;
  goto LAB_00112ad1;
code_r0x00112911:
  puVar33 = puVar33 + 1;
  puVar22 = puVar22 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar33) goto LAB_00112921;
  goto LAB_00112902;
LAB_00112d55:
  puVar22 = (ulong *)((long)puVar35 + 1);
  uVar31 = (int)puVar22 - iVar7;
  puVar36 = (ulong *)((long)puVar35 + 2);
  if (puVar11 < puVar36) goto LAB_00111dfc;
  goto LAB_001126ad;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}